

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

bool __thiscall FTagManager::SectorHasTag(FTagManager *this,int i,int tag)

{
  bool bVar1;
  int *piVar2;
  FTagItem *pFVar3;
  int local_24;
  int ndx;
  int tag_local;
  int i_local;
  FTagManager *this_local;
  
  bVar1 = SectorHasTags(this,i);
  if (bVar1) {
    piVar2 = TArray<int,_int>::operator[](&this->startForSector,(long)i);
    local_24 = *piVar2;
    while (pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)local_24),
          pFVar3->target == i) {
      pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)local_24);
      if (pFVar3->tag == tag) {
        return true;
      }
      local_24 = local_24 + 1;
    }
  }
  return false;
}

Assistant:

bool FTagManager::SectorHasTag(int i, int tag) const
{
	if (SectorHasTags(i))
	{
		int ndx = startForSector[i];
		while (allTags[ndx].target == i)
		{
			if (allTags[ndx].tag == tag) return true;
			ndx++;
		}
	}
	return false;
}